

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setWindowState(QWidget *this,WindowStates newstate)

{
  undefined1 *puVar1;
  uint uVar2;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar3;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  QFlagsStorage<Qt::WindowState> QVar8;
  QFlagsStorage<Qt::WindowState> QVar9;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(uint *)&this->data->field_0x10;
  QVar8.i = uVar2 & 0xf;
  QVar9.i = (Int)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i;
  if (((uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i & 1) != 0) {
    QVar9.i = (uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                    super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7;
  }
  if (QVar8.i != QVar9.i) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->high_attributes[0] & 0x10000000) == 0)) {
      create(this,0,false,false);
    }
    *(uint *)&this->data->field_0x10 = *(uint *)&this->data->field_0x10 & 0xfffffff0 | QVar9.i & 0xf
    ;
    puVar1 = &this->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x800;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      if (((*(byte *)(*(long *)&this->field_0x8 + 0x241) & 4) == 0) &&
         ((this->data->widget_attributes & 0x8000) == 0)) {
        adjustSize(this);
      }
      QWidgetPrivate::createTLExtra(this_00);
      if ((uVar2 & 7) == 0) {
        pQVar3 = this->data;
        QWidgetPrivate::createTLExtra(this_00);
        _Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
        iVar5 = (pQVar3->crect).y1.m_i;
        iVar6 = (pQVar3->crect).x2.m_i;
        iVar7 = (pQVar3->crect).y2.m_i;
        *(int *)((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) =
             (pQVar3->crect).x1.m_i;
        *(int *)((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa4) = iVar5;
        *(int *)((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = iVar6;
        *(int *)((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xac) = iVar7;
      }
      QWindow::setWindowStates
                (*(undefined8 *)(*(long *)(*(long *)(*(long *)&this->field_0x8 + 0x78) + 8) + 0x20),
                 (uint)newstate.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                       super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7);
    }
    puVar1 = &this->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffff7ff;
    if ((QVar9.i & 8) != 0) {
      activateWindow(this);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent((QWindowStateChangeEvent *)&local_58,QVar8.i,0)
    ;
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setWindowState(Qt::WindowStates newstate)
{
    Q_D(QWidget);
    Qt::WindowStates oldstate = windowState();
    if (newstate.testFlag(Qt::WindowMinimized)) // QTBUG-46763
       newstate.setFlag(Qt::WindowActive, false);
    if (oldstate == newstate)
        return;
    if (isWindow() && !testAttribute(Qt::WA_WState_Created))
        create();

    data->window_state = newstate;
    data->in_set_window_state = 1;
    if (isWindow()) {
        // Ensure the initial size is valid, since we store it as normalGeometry below.
        if (!testAttribute(Qt::WA_Resized) && !isVisible())
            adjustSize();

        d->createTLExtra();
        if (!(oldstate & (Qt::WindowMinimized | Qt::WindowMaximized | Qt::WindowFullScreen)))
            d->topData()->normalGeometry = geometry();

        Q_ASSERT(windowHandle());
        windowHandle()->setWindowStates(newstate & ~Qt::WindowActive);
    }
    data->in_set_window_state = 0;

    if (newstate & Qt::WindowActive)
        activateWindow();

    QWindowStateChangeEvent e(oldstate);
    QCoreApplication::sendEvent(this, &e);
}